

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dac_control.c
# Opt level: O0

void daccontrol_start(void *info,UINT32 DataPos,UINT8 LenMode,UINT32 Length)

{
  ushort uVar1;
  byte bVar2;
  UINT16 CmdStepBase;
  dac_control *chip;
  UINT32 Length_local;
  UINT8 LenMode_local;
  UINT32 DataPos_local;
  void *info_local;
  
  if ((*(byte *)((long)info + 0x7c) & 0x80) == 0) {
    uVar1 = (ushort)*(byte *)((long)info + 0x54) * (ushort)*(byte *)((long)info + 0x75);
    if ((DataPos != 0xffffffff) &&
       (*(UINT32 *)((long)info + 0x70) = DataPos + uVar1,
       *(uint *)((long)info + 0x60) < *(uint *)((long)info + 0x70))) {
      *(undefined4 *)((long)info + 0x70) = *(undefined4 *)((long)info + 0x60);
    }
    switch(LenMode & 0xf) {
    case 0:
      break;
    case 1:
      *(UINT32 *)((long)info + 0x78) = Length;
      break;
    case 2:
      *(uint *)((long)info + 0x78) = (Length * 1000) / *(uint *)((long)info + 0x5c);
      break;
    case 3:
      *(uint *)((long)info + 0x78) =
           (*(int *)((long)info + 0x60) - (*(int *)((long)info + 0x70) - (uint)uVar1)) /
           (uint)*(byte *)((long)info + 0x98);
      break;
    default:
      *(undefined4 *)((long)info + 0x78) = 0;
      break;
    case 0xf:
      *(uint *)((long)info + 0x78) = Length / *(byte *)((long)info + 0x98);
    }
    *(char *)((long)info + 0x7d) = (char)((int)(LenMode & 0x10) >> 4);
    *(undefined4 *)((long)info + 0x90) = *(undefined4 *)((long)info + 0x78);
    RC_RESET_PRESTEP((RATIO_CNTR *)((long)info + 0x80));
    if (*(char *)((long)info + 0x7d) == '\0') {
      *(undefined4 *)((long)info + 0x94) = 0;
    }
    else {
      *(uint *)((long)info + 0x94) =
           (*(int *)((long)info + 0x78) + -1) * (uint)*(byte *)((long)info + 0x98);
    }
    *(byte *)((long)info + 0x7c) = *(byte *)((long)info + 0x7c) & 0xfb;
    bVar2 = 0;
    if ((LenMode & 0x80) != 0) {
      bVar2 = 4;
    }
    *(byte *)((long)info + 0x7c) = *(byte *)((long)info + 0x7c) | bVar2;
    *(byte *)((long)info + 0x7c) = *(byte *)((long)info + 0x7c) | 1;
  }
  return;
}

Assistant:

void daccontrol_start(void* info, UINT32 DataPos, UINT8 LenMode, UINT32 Length)
{
	dac_control* chip = (dac_control*)info;
	UINT16 CmdStepBase;
	
	if (chip->Running & 0x80)
		return;
	
	CmdStepBase = chip->CmdSize * chip->StepBase;
	if (DataPos != (UINT32)-1)	// skip setting DataStart, if Pos == -1
	{
		chip->DataStart = DataPos + CmdStepBase;
		if (chip->DataStart > chip->DataLen)	// catch bad value and force silence
			chip->DataStart = chip->DataLen;
	}
	
	switch(LenMode & 0x0F)
	{
	case DCTRL_LMODE_IGNORE:	// Length is already set - ignore
		break;
	case DCTRL_LMODE_CMDS:		// Length = number of commands
		chip->CmdsToSend = Length;
		break;
	case DCTRL_LMODE_MSEC:		// Length = time in msec
		chip->CmdsToSend = 1000 * Length / chip->Frequency;
		break;
	case DCTRL_LMODE_TOEND:		// play until stop-command is received (or data-end is reached)
		chip->CmdsToSend = (chip->DataLen - (chip->DataStart - CmdStepBase)) / chip->DataStep;
		break;
	case DCTRL_LMODE_BYTES:		// raw byte count
		chip->CmdsToSend = Length / chip->DataStep;
		break;
	default:
		chip->CmdsToSend = 0x00;
		break;
	}
	chip->Reverse = (LenMode & 0x10) >> 4;
	
	chip->RemainCmds = chip->CmdsToSend;
	RC_RESET_PRESTEP(&chip->stepCntr);	// first sample is sent with next update
	if (! chip->Reverse)
		chip->RealPos = 0x00;
	else
		chip->RealPos = (chip->CmdsToSend - 1) * chip->DataStep;
	
	chip->Running &= ~0x04;
	chip->Running |= (LenMode & 0x80) ? 0x04 : 0x00;	// set loop mode
	
	chip->Running |= 0x01;	// start
	
	return;
}